

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjComputeTruthTableStart(Gia_Man_t *p,int nVarsMax)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  int iVar4;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    p->nTtVars = nVarsMax;
    iVar4 = 1 << ((char)nVarsMax - 6U & 0x1f);
    if (nVarsMax < 7) {
      iVar4 = 1;
    }
    p->nTtWords = iVar4;
    pVVar1 = Vec_IntAlloc(0x100);
    p->vTtNodes = pVVar1;
    iVar4 = 6;
    if (6 < p->nTtVars) {
      iVar4 = p->nTtVars;
    }
    pVVar2 = Vec_PtrAllocTruthTables(iVar4);
    p->vTtInputs = pVVar2;
    pVVar3 = Vec_WrdStart(p->nTtWords << 6);
    p->vTtMemory = pVVar3;
    pVVar1 = Vec_IntAlloc(p->nObjs + 1000);
    p->vTtNums = pVVar1;
    Vec_IntFill(pVVar1,pVVar1->nCap,-1000000000);
    return;
  }
  __assert_fail("p->vTtMemory == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                ,0x14a,"void Gia_ObjComputeTruthTableStart(Gia_Man_t *, int)");
}

Assistant:

void Gia_ObjComputeTruthTableStart( Gia_Man_t * p, int nVarsMax )
{
    assert( p->vTtMemory == NULL );
    p->nTtVars   = nVarsMax;
    p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
    p->vTtNodes  = Vec_IntAlloc( 256 );
    p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
    p->vTtMemory = Vec_WrdStart( p->nTtWords * 64 );
    p->vTtNums   = Vec_IntAlloc( Gia_ManObjNum(p) + 1000 );
    Vec_IntFill( p->vTtNums, Vec_IntCap(p->vTtNums), -ABC_INFINITY );
}